

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O2

int tlp_mr_data_length(tlp_mr_hdr *mh)

{
  int iVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  
  uVar3 = (mh->tlp).falen;
  iVar4 = ((ushort)(uVar3 << 8 | uVar3 >> 8) & 0x3ff) << 2;
  bVar2 = mh->field_0x7;
  if (((bVar2 & 0xf) != 0) && ((bVar2 & 0xf) != 0xf)) {
    for (uVar7 = 0; uVar7 != 4; uVar7 = uVar7 + 1) {
      iVar4 = iVar4 + -1 + (uint)(((bVar2 & 0xf) >> (uVar7 & 0x1f) & 1) != 0);
    }
  }
  iVar5 = iVar4;
  if (0x1f < (byte)(bVar2 + 0x10)) {
    iVar1 = iVar4 + -4;
    iVar6 = 0;
    while ((iVar5 = iVar1, iVar6 != 4 &&
           (iVar5 = iVar4, ((uint)(bVar2 >> 4) << ((byte)iVar6 & 0x1f) & 8) == 0))) {
      iVar4 = iVar4 + -1;
      iVar6 = iVar6 + 1;
    }
  }
  return iVar5;
}

Assistant:

int tlp_mr_data_length(struct tlp_mr_hdr *mh)
{
	int n;
	uint32_t len;

	len = tlp_length(mh->tlp.falen) << 2;

	if (mh->fstdw && mh->fstdw != 0xF) {
		for (n = 0; n < 4; n++) {
			if ((mh->fstdw & (0x1 << n)) == 0) {
				len--;
			}
		}
	}

	if (mh->lstdw && mh->lstdw != 0xF) {
		for (n = 0; n < 4; n++) {
			if ((mh->lstdw & (0x8 >> n)) == 0) {
				len--;
			} else
				break;
		}
	}

	return len;
}